

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O2

void avro::codec_traits<uau::_union_array_union_Union__0__>::decode
               (Decoder *d,_union_array_union_Union__0__ *v)

{
  ulong uVar1;
  Exception *this;
  allocator<char> local_39;
  int32_t vv;
  
  uVar1 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar1) {
    this = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vv,"Union index too big",&local_39);
    Exception::Exception(this,(string *)&vv);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar1 & 1) != 0) {
    vv = (**(code **)(*(long *)d + 0x28))(d);
    uau::_union_array_union_Union__0__::set_int(v,&vv);
    return;
  }
  (**(code **)(*(long *)d + 0x18))(d);
  uau::_union_array_union_Union__0__::set_null(v);
  return;
}

Assistant:

static void decode(Decoder& d, uau::_union_array_union_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                int32_t vv;
                avro::decode(d, vv);
                v.set_int(vv);
            }
            break;
        }
    }